

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O0

void Am_Register_Slot_Key(Am_Slot_Key key,char *string)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char *prev_name;
  int prev_key;
  char *string_local;
  Am_Slot_Key key_local;
  
  verify_slot_name_key_table();
  iVar1 = Am_Symbol_Table::Get_Value(Am_Slot_Name_Key_Table,string);
  if (iVar1 != -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Slot Name, ");
    poVar2 = std::operator<<(poVar2,string);
    poVar2 = std::operator<<(poVar2,", has been overwritten.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  pcVar3 = Am_Symbol_Table::Get_Key(Am_Slot_Name_Key_Table,(uint)key);
  if (pcVar3 != (char *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Slot Key, ");
    Am_Print_Key((ostream *)&std::cerr,key);
    poVar2 = std::operator<<((ostream *)&std::cerr,", has already been used.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Symbol_Table::Add_Item(Am_Slot_Name_Key_Table,(uint)key,string);
  return;
}

Assistant:

void
Am_Register_Slot_Key(Am_Slot_Key key, const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key != -1) {
    std::cerr << "Slot Name, " << string << ", has been overwritten."
              << std::endl;
    Am_Error();
  }
  const char *prev_name = Am_Slot_Name_Key_Table->Get_Key(key);
  if (prev_name) {
    std::cerr << "Slot Key, ";
    Am_Print_Key(std::cerr, key);
    std::cerr << ", has already been used." << std::endl;
    Am_Error();
  }
  Am_Slot_Name_Key_Table->Add_Item(key, string);
}